

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O1

void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *p,int nSupersMax)

{
  long *__ptr;
  Map_Super_t *pMVar1;
  ulong uVar2;
  Map_HashEntry_t *pMVar3;
  ulong __nmemb;
  long lVar4;
  ulong uVar5;
  
  __ptr = (long *)malloc((long)nSupersMax << 3);
  if (0 < p->nBins) {
    lVar4 = 0;
    do {
      for (pMVar3 = p->pBins[lVar4]; pMVar3 != (Map_HashEntry_t *)0x0; pMVar3 = pMVar3->pNext) {
        uVar5 = 0;
        for (pMVar1 = pMVar3->pGates; pMVar1 != (Map_Super_t *)0x0; pMVar1 = pMVar1->pNext) {
          __ptr[uVar5] = (long)pMVar1;
          uVar5 = uVar5 + 1;
        }
        pMVar3->pGates = (Map_Super_t *)0x0;
        if ((uint)uVar5 != 0) {
          __nmemb = uVar5 & 0xffffffff;
          qsort(__ptr,__nmemb,8,Map_SuperTableCompareGatesInList);
          if (*(float *)(*__ptr + 0xec) <= *(float *)(__ptr[__nmemb - 1] + 0xec) &&
              *(float *)(__ptr[__nmemb - 1] + 0xec) != *(float *)(*__ptr + 0xec)) {
            __assert_fail("Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                          ,0x184,"void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *, int)")
            ;
          }
          pMVar1 = pMVar3->pGates;
          uVar2 = 0;
          do {
            *(Map_Super_t **)(__ptr[uVar2] + 0xf8) = pMVar1;
            pMVar1 = (Map_Super_t *)__ptr[uVar2];
            pMVar3->pGates = pMVar1;
            uVar2 = uVar2 + 1;
          } while (__nmemb != uVar2);
          *(uint *)&pMVar3->pGates->field_0x4 =
               *(uint *)&pMVar3->pGates->field_0x4 & 0xf0000fff | ((uint)uVar5 & 0xffff) << 0xc;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nBins);
  }
  if (__ptr != (long *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Map_SuperTableSortSupergatesByDelay( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i, k;

    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
        {
            // collect the gates in this entry
            nSupers = 0;
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
            {
                // skip supergates, whose root is the AND gate
//                if ( strcmp( Mio_GateReadName(pSuper->pRoot), "and" ) == 0 )
//                    continue;
                ppSupers[nSupers++] = pSuper;
            }
            pEnt->pGates = NULL;
            if ( nSupers == 0 )
                continue;
            // sort the gates by delay
            qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
                    (int (*)(const void *, const void *)) Map_SuperTableCompareGatesInList );
            assert( Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0 );
            // link them in the reverse order
            for ( k = 0; k < nSupers; k++ )
            {
                ppSupers[k]->pNext = pEnt->pGates;
                pEnt->pGates = ppSupers[k];
            }
            // save the number of supergates in the list
            pEnt->pGates->nSupers = nSupers;
        }
    ABC_FREE( ppSupers );
}